

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall
testing::UnitTest::set_current_test_suite(UnitTest *this,TestSuite *a_current_test_suite)

{
  internal::MutexBase::Lock(&(this->mutex_).super_MutexBase);
  this->impl_->current_test_suite_ = a_current_test_suite;
  internal::MutexBase::Unlock(&(this->mutex_).super_MutexBase);
  return;
}

Assistant:

void UnitTest::set_current_test_suite(TestSuite* a_current_test_suite) {
  internal::MutexLock lock(&mutex_);
  impl_->set_current_test_suite(a_current_test_suite);
}